

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmGeneratorTarget *this;
  char *pcVar1;
  undefined8 __p;
  bool value;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool value_00;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  string *psVar7;
  ostream *poVar8;
  pointer ppcVar9;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string report;
  string reportEntry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  ostringstream e;
  bool local_2aa;
  _Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false> local_288;
  string local_280;
  string local_260;
  undefined1 local_240 [32];
  char *local_220;
  pointer local_218;
  pointer local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [3];
  undefined1 local_1a8 [376];
  
  value = getTypedProperty<bool>(tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1f0,tgt);
  bVar2 = cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1f0,p);
  bVar3 = cm::
          contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&tgt->LinkImplicitNullProperties,p);
  if (bVar2 && bVar3) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x17f5,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar6 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_1a8._0_8_ = &DAT_0000000b;
    local_1a8._8_8_ = " * Target \"";
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    local_1d8[0]._8_8_ = (psVar7->_M_dataplus)._M_p;
    local_1d8[0]._0_8_ = psVar7->_M_string_length;
    cmStrCat<>(&local_280,(cmAlphaNum *)local_1a8,(cmAlphaNum *)local_1d8);
    if (bVar2) {
      std::__cxx11::string::append((char *)&local_280);
      valueAsString<bool>((string *)local_1a8,value);
      std::__cxx11::string::append((string *)&local_280);
      std::__cxx11::string::~string((string *)local_1a8);
    }
    std::__cxx11::string::append((char *)&local_280);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "INTERFACE_",p);
    local_288._M_head_impl = (cmGeneratorExpressionInterpreter *)0x0;
    bVar4 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar4) {
      local_240._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 (cmGeneratorTarget **)config);
      __p = local_1a8._0_8_;
      local_1a8._0_8_ = (pointer)0x0;
      std::
      __uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::reset((__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               *)&local_288,(pointer)__p);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                     *)local_1a8);
    }
    local_218 = (pvVar6->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    ppcVar9 = (pvVar6->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_2aa = bVar2;
    local_220 = defaultValue;
    while (ppcVar9 != local_218) {
      this = *ppcVar9;
      local_210 = ppcVar9;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_208,this);
      bVar5 = cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
      value_00 = getTypedProperty<bool>(this,(string *)local_1d8,local_288._M_head_impl);
      local_240._0_8_ = local_240 + 0x10;
      local_240._8_8_ = 0;
      local_240[0x10] = '\0';
      bVar4 = value;
      if (bVar5) {
        std::__cxx11::string::append((char *)local_240);
        cmGeneratorTarget::GetName_abi_cxx11_(this);
        std::__cxx11::string::append((string *)local_240);
        std::__cxx11::string::append((char *)local_240);
        valueAsString<bool>((string *)local_1a8,value_00);
        std::__cxx11::string::append((string *)local_240);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::append((char *)local_240);
        if (bVar2) {
          std::__cxx11::string::append((string *)&local_280);
          compatibilityAgree_abi_cxx11_((string *)local_1a8,t,false);
          std::__cxx11::string::append((string *)&local_280);
          std::__cxx11::string::~string((string *)local_1a8);
          if (value_00 != value) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar8 = std::operator<<((ostream *)local_1a8,"Property ");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," on target \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            poVar8 = std::operator<<(poVar8,"\" does\nnot match the INTERFACE_");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," property requirement\nof dependency \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            std::operator<<(poVar8,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_260);
LAB_002e8a41:
            std::__cxx11::string::~string((string *)&local_260);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
LAB_002e8b62:
            std::__cxx11::string::~string((string *)local_240);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_208);
            break;
          }
        }
        else if (bVar3) {
          std::__cxx11::string::append((string *)&local_280);
          compatibilityAgree_abi_cxx11_((string *)local_1a8,t,false);
          std::__cxx11::string::append((string *)&local_280);
          std::__cxx11::string::~string((string *)local_1a8);
          if (value_00) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            pcVar1 = local_220;
            poVar8 = std::operator<<((ostream *)local_1a8,"Property ");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," on target \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            poVar8 = std::operator<<(poVar8,"\" is\nimplied to be ");
            poVar8 = std::operator<<(poVar8,pcVar1);
            poVar8 = std::operator<<(poVar8,
                                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                    );
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," property on\ndependency \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            std::operator<<(poVar8,"\" is in conflict.\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_260);
            std::__cxx11::string::~string((string *)&local_260);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            value = false;
            goto LAB_002e8b62;
          }
          bVar4 = false;
        }
        else if (local_2aa == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,"(Interface set)\n");
          std::__cxx11::string::append((string *)&local_280);
          std::__cxx11::string::~string((string *)local_1a8);
          local_2aa = true;
          bVar4 = value_00;
        }
        else {
          std::__cxx11::string::append((string *)&local_280);
          compatibilityAgree_abi_cxx11_((string *)local_1a8,t,false);
          std::__cxx11::string::append((string *)&local_280);
          std::__cxx11::string::~string((string *)local_1a8);
          local_2aa = true;
          if (value_00 != value) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar8 = std::operator<<((ostream *)local_1a8,"The INTERFACE_");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," property of \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            poVar8 = std::operator<<(poVar8,"\" does\nnot agree with the value of ");
            poVar8 = std::operator<<(poVar8,(string *)p);
            poVar8 = std::operator<<(poVar8," already determined\nfor \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar8 = std::operator<<(poVar8,(string *)psVar7);
            std::operator<<(poVar8,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_260);
            goto LAB_002e8a41;
          }
        }
      }
      else {
        if (bVar3) {
          bVar4 = false;
        }
        if (bVar2) {
          bVar4 = value;
        }
      }
      value = bVar4;
      std::__cxx11::string::~string((string *)local_240);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208);
      ppcVar9 = local_210 + 1;
    }
    valueAsString<bool>((string *)local_1a8,value);
    compatibilityType_abi_cxx11_((string *)local_240,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,p,(string *)local_1a8,&local_280,(string *)local_240);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string((string *)local_1a8);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                   *)&local_288);
    std::__cxx11::string::~string((string *)local_1d8[0]._M_local_buf);
    std::__cxx11::string::~string((string *)&local_280);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  return value;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}